

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_spv_amd_shader_trinary_minmax_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t param_5)

{
  char *op;
  uint32_t op0;
  undefined4 in_register_0000000c;
  uint32_t op1;
  uint32_t op2;
  undefined4 in_register_0000008c;
  uint32_t local_54;
  string local_50;
  
  local_54 = eop;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_AMD_shader_trinary_minmax","",
             CONCAT44(in_register_0000000c,eop),args,CONCAT44(in_register_0000008c,param_5));
  require_extension_internal(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (eop < 10) {
    if ((0xeU >> (eop & 0x1f) & 1) == 0) {
      if ((0x70U >> (eop & 0x1f) & 1) == 0) {
        if ((0x380U >> (eop & 0x1f) & 1) == 0) goto LAB_0027653b;
        op0 = *args;
        op1 = args[1];
        op2 = args[2];
        op = "mid3";
      }
      else {
        op0 = *args;
        op1 = args[1];
        op2 = args[2];
        op = "max3";
      }
    }
    else {
      op0 = *args;
      op1 = args[1];
      op2 = args[2];
      op = "min3";
    }
    emit_trinary_func_op(this,result_type,id,op0,op1,op2,op);
  }
  else {
LAB_0027653b:
    statement<char_const(&)[51],unsigned_int&>
              (this,(char (*) [51])"// unimplemented SPV AMD shader trinary minmax op ",&local_54);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_spv_amd_shader_trinary_minmax_op(uint32_t result_type, uint32_t id, uint32_t eop,
                                                         const uint32_t *args, uint32_t)
{
	require_extension_internal("GL_AMD_shader_trinary_minmax");

	enum AMDShaderTrinaryMinMax
	{
		FMin3AMD = 1,
		UMin3AMD = 2,
		SMin3AMD = 3,
		FMax3AMD = 4,
		UMax3AMD = 5,
		SMax3AMD = 6,
		FMid3AMD = 7,
		UMid3AMD = 8,
		SMid3AMD = 9
	};

	auto op = static_cast<AMDShaderTrinaryMinMax>(eop);

	switch (op)
	{
	case FMin3AMD:
	case UMin3AMD:
	case SMin3AMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "min3");
		break;

	case FMax3AMD:
	case UMax3AMD:
	case SMax3AMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "max3");
		break;

	case FMid3AMD:
	case UMid3AMD:
	case SMid3AMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "mid3");
		break;

	default:
		statement("// unimplemented SPV AMD shader trinary minmax op ", eop);
		break;
	}
}